

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
libcellml::Annotator::AnnotatorImpl::addIssueInvalidArgument
          (AnnotatorImpl *this,CellmlElementType type)

{
  element_type *peVar1;
  IssuePtr IVar2;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> description;
  IssuePtr issue;
  CellmlElementType type_local;
  AnnotatorImpl *this_local;
  
  IVar2 = Issue::IssueImpl::create();
  cellmlElementTypeAsString_abi_cxx11_
            (&local_88,(libcellml *)(ulong)type,
             (CellmlElementType)
             IVar2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  std::operator+(&local_68,"The item is internally inconsistent: the enum type \'",&local_88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,"\' cannot be used with the stored item.");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  peVar1 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(description.field_2._M_local_buf + 8));
  Issue::IssueImpl::setDescription(peVar1->mPimpl,(string *)local_48);
  peVar1 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(description.field_2._M_local_buf + 8));
  Issue::IssueImpl::setReferenceRule(peVar1->mPimpl,ANNOTATOR_INCONSISTENT_TYPE);
  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)((long)&description.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)local_48);
  std::shared_ptr<libcellml::Issue>::~shared_ptr
            ((shared_ptr<libcellml::Issue> *)((long)&description.field_2 + 8));
  return;
}

Assistant:

void Annotator::AnnotatorImpl::addIssueInvalidArgument(CellmlElementType type)
{
    auto issue = Issue::IssueImpl::create();
    auto description = "The item is internally inconsistent: the enum type '" + cellmlElementTypeAsString(type) + "' cannot be used with the stored item.";
    issue->mPimpl->setDescription(description);
    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ANNOTATOR_INCONSISTENT_TYPE);
    addIssue(issue);
}